

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  uint uVar1;
  undefined8 xStride;
  Array<char> *pAVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint64_t *puVar7;
  long lVar8;
  PixelType PVar9;
  ulong uVar10;
  pointer puVar11;
  uint uVar12;
  Data *pDVar13;
  uint uVar14;
  pointer puVar15;
  LineBuffer *pLVar16;
  PixelType *pPVar17;
  ulong uVar18;
  bool bVar19;
  char *writePtr;
  char *readPtr;
  char *compPtr;
  int local_54;
  Array<char> *local_50;
  Array<char> *local_48;
  uint local_3c;
  long local_38;
  
  pDVar13 = this->_ofd;
  pLVar16 = this->_lineBuffer;
  if (*(int *)&(pDVar13->frameBuffer)._sampleCounts.base == 0) {
    puVar7 = &pLVar16->dataSize;
    uVar14 = *(int *)((long)&pLVar16->dataSize + 4) + 1;
    local_54 = 1;
  }
  else {
    puVar7 = (uint64_t *)((long)&pLVar16->dataSize + 4);
    uVar14 = (int)pLVar16->dataSize - 1;
    local_54 = -1;
  }
  uVar12 = (uint)*puVar7;
  if (uVar12 != uVar14) {
    local_3c = uVar14;
    do {
      local_50 = (Array<char> *)
                 ((long)&((pLVar16->buffer)._data)->_size +
                 *(long *)(*(long *)&pDVar13->maxY +
                          ((long)(int)uVar12 -
                          (long)*(int *)((long)&(pDVar13->frameBuffer)._sampleCounts.xStride + 4)) *
                          8));
      puVar15 = (pDVar13->bytesPerLine).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pDVar13->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar15) {
        uVar10 = 0;
        uVar18 = 1;
        do {
          uVar14 = *(uint *)((long)puVar15 + uVar10 * 0x30 + 0x24);
          if ((int)uVar12 < 0) {
            if (-1 < (int)uVar14) {
              uVar4 = (uVar14 + ~uVar12) / uVar14;
              goto LAB_00195f54;
            }
            uVar4 = (~uVar14 - uVar12) / -uVar14;
          }
          else if ((int)uVar14 < 0) {
            uVar4 = uVar12 / -uVar14;
LAB_00195f54:
            uVar4 = -uVar4;
          }
          else {
            uVar4 = uVar12 / uVar14;
          }
          if (uVar12 == uVar4 * uVar14) {
            pPVar17 = (PixelType *)(puVar15 + uVar10 * 6);
            uVar4 = *(uint *)((long)&(pDVar13->frameBuffer)._sampleCounts.base + 4);
            PVar9 = pPVar17[8];
            if ((int)uVar4 < 0) {
              if (-1 < (int)PVar9) {
                uVar4 = (~uVar4 + PVar9) / PVar9;
                goto LAB_00195fa8;
              }
              uVar4 = (~PVar9 - uVar4) / -PVar9;
            }
            else if ((int)PVar9 < 0) {
              uVar4 = uVar4 / -PVar9;
LAB_00195fa8:
              uVar4 = -uVar4;
            }
            else {
              uVar4 = uVar4 / PVar9;
            }
            uVar5 = (uint)(pDVar13->frameBuffer)._sampleCounts.xStride;
            if ((int)uVar5 < 0) {
              if (-1 < (int)PVar9) {
                uVar5 = ~uVar5 + PVar9;
                goto LAB_00195fe6;
              }
              uVar5 = (~PVar9 - uVar5) / -PVar9;
            }
            else if ((int)PVar9 < 0) {
              PVar9 = -PVar9;
LAB_00195fe6:
              uVar5 = -(uVar5 / PVar9);
            }
            else {
              uVar5 = uVar5 / PVar9;
            }
            if ((char)pPVar17[10] == HALF) {
              fillChannelWithZeroes
                        ((char **)&local_50,
                         *(Format *)
                          &(pDVar13->lineOffsets).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,*pPVar17,
                         (long)(int)((uVar5 - uVar4) + 1));
            }
            else {
              if ((int)uVar12 < 0) {
                if (-1 < (int)uVar14) {
                  uVar1 = uVar14 + ~uVar12;
                  goto LAB_00196047;
                }
                uVar14 = (~uVar14 - uVar12) / -uVar14;
              }
              else if ((int)uVar14 < 0) {
                uVar14 = -uVar14;
                uVar1 = uVar12;
LAB_00196047:
                uVar14 = -(uVar1 / uVar14);
              }
              else {
                uVar14 = uVar12 / uVar14;
              }
              lVar8 = (long)(int)uVar14 * *(undefined8 *)(pPVar17 + 6) +
                      *(undefined8 *)(pPVar17 + 2);
              xStride = *(undefined8 *)(pPVar17 + 4);
              local_48 = (Array<char> *)((long)(int)uVar4 * xStride + lVar8);
              copyFromFrameBuffer((char **)&local_50,(char **)&local_48,
                                  (char *)((long)(int)uVar5 * xStride + lVar8),xStride,
                                  *(Format *)
                                   &(pDVar13->lineOffsets).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,*pPVar17);
            }
          }
          pDVar13 = this->_ofd;
          puVar15 = (pDVar13->bytesPerLine).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(pDVar13->bytesPerLine).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar15 >> 4) *
                   -0x5555555555555555;
          bVar19 = uVar18 <= uVar10;
          lVar8 = uVar10 - uVar18;
          uVar10 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar19 && lVar8 != 0);
        pLVar16 = this->_lineBuffer;
        uVar14 = local_3c;
      }
      if ((Array<char> *)pLVar16->dataPtr < local_50) {
        pLVar16->dataPtr = (char *)local_50;
      }
      uVar12 = uVar12 + local_54;
    } while (uVar12 != uVar14);
  }
  if (((int)uVar14 < (int)pLVar16->uncompressedDataSize) ||
     (*(int *)((long)&pLVar16->uncompressedDataSize + 4) < (int)uVar14)) {
    pAVar2 = (pLVar16->buffer)._data;
    (pLVar16->consecutiveBuffer)._size = (long)pAVar2;
    *(int *)&(pLVar16->consecutiveBuffer)._data = *(int *)&pLVar16->dataPtr - (int)pAVar2;
    plVar3 = (long *)(pLVar16->sampleCountTableBuffer)._size;
    if (plVar3 != (long *)0x0) {
      iVar6 = (**(code **)(*plVar3 + 0x20))();
      pLVar16 = this->_lineBuffer;
      if (iVar6 < *(int *)&(pLVar16->consecutiveBuffer)._data) {
        *(int *)&(pLVar16->consecutiveBuffer)._data = iVar6;
        (pLVar16->consecutiveBuffer)._size = local_38;
      }
      else {
        pDVar13 = this->_ofd;
        if (*(int *)&(pDVar13->lineOffsets).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 0) {
          uVar14 = (uint)pLVar16->uncompressedDataSize;
          uVar12 = *(uint *)((long)&pLVar16->uncompressedDataSize + 4);
          local_50 = (pLVar16->buffer)._data;
          if ((int)uVar14 <= (int)uVar12) {
            puVar15 = (pDVar13->bytesPerLine).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar11 = (pDVar13->bytesPerLine).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            do {
              local_48 = local_50;
              if (puVar11 != puVar15) {
                uVar10 = 0;
                uVar18 = 1;
                do {
                  uVar4 = *(uint *)((long)puVar15 + uVar10 * 0x30 + 0x24);
                  if ((int)uVar14 < 0) {
                    if (-1 < (int)uVar4) {
                      uVar5 = (uVar4 + ~uVar14) / uVar4;
                      goto LAB_001961ed;
                    }
                    uVar5 = (~uVar4 - uVar14) / -uVar4;
                  }
                  else if ((int)uVar4 < 0) {
                    uVar5 = uVar14 / -uVar4;
LAB_001961ed:
                    uVar5 = -uVar5;
                  }
                  else {
                    uVar5 = uVar14 / uVar4;
                  }
                  if (uVar14 == uVar5 * uVar4) {
                    uVar4 = *(uint *)((long)&(pDVar13->frameBuffer)._sampleCounts.base + 4);
                    PVar9 = *(PixelType *)((long)(puVar15 + uVar10 * 6) + 0x20);
                    if ((int)uVar4 < 0) {
                      if (-1 < (int)PVar9) {
                        uVar4 = (~uVar4 + PVar9) / PVar9;
                        goto LAB_00196242;
                      }
                      uVar4 = (~PVar9 - uVar4) / -PVar9;
                    }
                    else if ((int)PVar9 < 0) {
                      uVar4 = uVar4 / -PVar9;
LAB_00196242:
                      uVar4 = -uVar4;
                    }
                    else {
                      uVar4 = uVar4 / PVar9;
                    }
                    uVar5 = (uint)(pDVar13->frameBuffer)._sampleCounts.xStride;
                    if ((int)uVar5 < 0) {
                      if (-1 < (int)PVar9) {
                        uVar5 = ~uVar5 + PVar9;
                        goto LAB_0019627b;
                      }
                      uVar5 = (~PVar9 - uVar5) / -PVar9;
                    }
                    else if ((int)PVar9 < 0) {
                      PVar9 = -PVar9;
LAB_0019627b:
                      uVar5 = -(uVar5 / PVar9);
                    }
                    else {
                      uVar5 = uVar5 / PVar9;
                    }
                    convertInPlace((char **)&local_50,(char **)&local_48,
                                   *(PixelType *)(puVar15 + uVar10 * 6),
                                   (long)(int)((uVar5 - uVar4) + 1));
                    puVar15 = (pDVar13->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    puVar11 = (pDVar13->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  }
                  uVar10 = ((long)puVar11 - (long)puVar15 >> 4) * -0x5555555555555555;
                  bVar19 = uVar18 <= uVar10;
                  lVar8 = uVar10 - uVar18;
                  uVar10 = uVar18;
                  uVar18 = (ulong)((int)uVar18 + 1);
                } while (bVar19 && lVar8 != 0);
              }
              bVar19 = uVar14 != uVar12;
              uVar14 = uVar14 + 1;
            } while (bVar19);
            pLVar16 = this->_lineBuffer;
          }
        }
      }
    }
    *(undefined1 *)&(pLVar16->sampleCountTableBuffer)._data = 0;
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
        // frame buffer into the line buffer
        //

        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop  = _lineBuffer->scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop  = _lineBuffer->scanLineMin - 1;
            dy     = -1;
        }

        int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //

            char* writePtr =
                _lineBuffer->buffer + _ofd->offsetInLineBuffer[y - _ofd->minY];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                const OutSliceInfo& slice = _ofd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                int dMinX = divp (_ofd->minX, slice.xSampling);
                int dMaxX = divp (_ofd->maxX, slice.xSampling);

                //
                // Fill the line buffer with with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //

                    fillChannelWithZeroes (
                        writePtr, _ofd->format, slice.type, dMaxX - dMinX + 1);
                }
                else
                {
                    //
                    // If necessary, convert the pixel data to Xdr format.
                    // Then store the pixel data in _ofd->lineBuffer.
                    //
                    // slice.base may be 'negative' but
                    // pointer arithmetic is not allowed to overflow, so
                    // perform computation with the non-pointer 'intptr_t' instead
                    //
                    intptr_t base = reinterpret_cast<intptr_t> (slice.base);
                    intptr_t linePtr =
                        base + divp (y, slice.ySampling) * slice.yStride;

                    const char* readPtr = reinterpret_cast<const char*> (
                        linePtr + dMinX * slice.xStride);
                    const char* endPtr = reinterpret_cast<const char*> (
                        linePtr + dMaxX * slice.xStride);

                    copyFromFrameBuffer (
                        writePtr,
                        readPtr,
                        endPtr,
                        slice.xStride,
                        _ofd->format,
                        slice.type);
                }
            }

            if (_lineBuffer->endOfLineBufferData < writePtr)
                _lineBuffer->endOfLineBufferData = writePtr;

#ifdef DEBUG

            assert (
                writePtr - (_lineBuffer->buffer +
                            _ofd->offsetInLineBuffer[y - _ofd->minY]) ==
                (int) _ofd->bytesPerLine[y - _ofd->minY]);

#endif
        }

        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we are done, otherwise compress the linebuffer
        //

        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY) return;

        _lineBuffer->dataPtr = _lineBuffer->buffer;

        _lineBuffer->dataSize =
            _lineBuffer->endOfLineBufferData - _lineBuffer->buffer;

        //
        // Compress the data
        //

        Compressor* compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char* compPtr;

            int compSize = compressor->compress (
                _lineBuffer->dataPtr,
                _lineBuffer->dataSize,
                _lineBuffer->minY,
                compPtr);

            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //

                convertToXdr (
                    _ofd,
                    _lineBuffer->buffer,
                    _lineBuffer->minY,
                    _lineBuffer->maxY,
                    _lineBuffer->dataSize);
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}